

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::torrent_error_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,torrent_error_alert *this)

{
  uint uVar1;
  error_category *peVar2;
  char *pcVar3;
  char msg [400];
  string local_1f8;
  string local_1d8;
  char local_1b8 [408];
  
  if ((this->error).failed_ == true) {
    uVar1 = (this->error).val_;
    peVar2 = (this->error).cat_;
    (*peVar2->_vptr_error_category[4])(&local_1d8,peVar2,(ulong)uVar1);
    convert_from_native(&local_1f8,&local_1d8);
    pcVar3 = filename(this);
    snprintf(local_1b8,400," ERROR: (%d %s) %s",(ulong)uVar1,local_1f8._M_dataplus._M_p,pcVar3);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  else {
    pcVar3 = filename(this);
    snprintf(local_1b8,400," ERROR: %s",pcVar3);
  }
  torrent_alert::message_abi_cxx11_(&local_1f8,&this->super_torrent_alert);
  std::operator+(__return_storage_ptr__,&local_1f8,local_1b8);
  std::__cxx11::string::~string((string *)&local_1f8);
  return __return_storage_ptr__;
}

Assistant:

std::string torrent_error_alert::message() const
	{
		char msg[400];
		if (error)
		{
			std::snprintf(msg, sizeof(msg), " ERROR: (%d %s) %s"
				, error.value(), convert_from_native(error.message()).c_str()
				, filename());
		}
		else
		{
			std::snprintf(msg, sizeof(msg), " ERROR: %s", filename());
		}
		return torrent_alert::message() + msg;
	}